

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ResultBuilder::captureExpression(ResultBuilder *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  IResultCapture *pIVar5;
  IContext *pIVar6;
  IConfig *pIVar7;
  undefined4 extraout_var;
  Ptr<const_Catch::IConfig> local_e0 [3];
  undefined1 local_c8 [8];
  AssertionResult result;
  ResultBuilder *this_local;
  
  result.m_resultData._64_8_ = this;
  build((AssertionResult *)local_c8,this);
  pIVar5 = getResultCapture();
  (*pIVar5->_vptr_IResultCapture[2])(pIVar5,local_c8);
  bVar1 = AssertionResult::isOk((AssertionResult *)local_c8);
  if (!bVar1) {
    pIVar6 = getCurrentContext();
    (*pIVar6->_vptr_IContext[6])(local_e0);
    pIVar7 = Ptr<const_Catch::IConfig>::operator->(local_e0);
    uVar3 = (*(pIVar7->super_IShared).super_NonCopyable._vptr_NonCopyable[8])();
    Ptr<const_Catch::IConfig>::~Ptr(local_e0);
    if ((uVar3 & 1) != 0) {
      this->m_shouldDebugBreak = true;
    }
    pIVar6 = getCurrentContext();
    iVar4 = (*pIVar6->_vptr_IContext[3])();
    bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))();
    if (((bVar2 & 1) != 0) || (((this->m_assertionInfo).resultDisposition & Normal) != 0)) {
      this->m_shouldThrow = true;
    }
  }
  AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  return;
}

Assistant:

void ResultBuilder::captureExpression() {
        AssertionResult result = build();
        getResultCapture().assertionEnded( result );

        if( !result.isOk() ) {
            if( getCurrentContext().getConfig()->shouldDebugBreak() )
                m_shouldDebugBreak = true;
            if( getCurrentContext().getRunner()->aborting() || (m_assertionInfo.resultDisposition & ResultDisposition::Normal) )
                m_shouldThrow = true;
        }
    }